

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O1

QByteArray * __thiscall
QCryptographicHash::result(QByteArray *__return_storage_ptr__,QCryptographicHash *this)

{
  QCryptographicHashPrivate::finalize(*(QCryptographicHashPrivate **)this);
  QByteArray::QByteArray
            (__return_storage_ptr__,(char *)(*(long *)this + 0x1a8),
             (ulong)*(byte *)(*(long *)this + 0x1e8));
  return __return_storage_ptr__;
}

Assistant:

QByteArray QCryptographicHash::result() const
{
    return resultView().toByteArray();
}